

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O2

Matrix * operator*(Matrix *__return_storage_ptr__,Matrix *lhs,Matrix *rhs)

{
  Fraction *pFVar1;
  Fraction *b;
  invalid_argument *this;
  int i;
  int i_00;
  int k;
  int j_00;
  int j;
  int j_01;
  Fraction local_38;
  
  if (lhs->m_ == rhs->n_) {
    Matrix::Matrix(__return_storage_ptr__,lhs->n_,rhs->m_,0);
    for (i_00 = 0; i_00 < __return_storage_ptr__->n_; i_00 = i_00 + 1) {
      for (j_01 = 0; j_01 < __return_storage_ptr__->m_; j_01 = j_01 + 1) {
        for (j_00 = 0; j_00 < lhs->m_; j_00 = j_00 + 1) {
          pFVar1 = Matrix::At(lhs,i_00,j_00);
          b = Matrix::At(rhs,j_00,j_01);
          local_38 = operator*(pFVar1,b);
          pFVar1 = Matrix::At(__return_storage_ptr__,i_00,j_01);
          Fraction::operator+=(pFVar1,&local_38);
        }
      }
    }
    return __return_storage_ptr__;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"[MUL] Mismatched number of rows");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

int Matrix::GetNumColumns() const {
  return m_;
}